

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.cpp
# Opt level: O0

int __thiscall argo::pointer::from_hex(pointer *this,string *s,size_t index)

{
  char cVar1;
  char *pcVar2;
  json_pointer_exception *this_00;
  char c;
  size_t index_local;
  string *s_local;
  pointer *this_local;
  
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)s);
  cVar1 = *pcVar2;
  if ((cVar1 < '0') || ('9' < cVar1)) {
    if ((cVar1 < 'A') || ('F' < cVar1)) {
      this_00 = (json_pointer_exception *)__cxa_allocate_exception(0xd8);
      json_pointer_exception::json_pointer_exception
                (this_00,syntax_error_in_pointer_string_e,(int)index + -1);
      __cxa_throw(this_00,&json_pointer_exception::typeinfo,
                  json_pointer_exception::~json_pointer_exception);
    }
    this_local._4_4_ = cVar1 + -0x37;
  }
  else {
    this_local._4_4_ = cVar1 + -0x30;
  }
  return this_local._4_4_;
}

Assistant:

int pointer::from_hex(const string &s, size_t index)
{
    char c = s[index];

    if (c >= '0' && c <= '9')
    {
        return c - '0';
    }
    else if (c >= 'A' && c <= 'F')
    {
        return c - 'A' + 10;
    }
    else
    {
        throw json_pointer_exception(json_exception::syntax_error_in_pointer_string_e, index - 1);
    }
}